

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O0

DecodeStatus
DecodeBgtzGroupBranch_4(MCInst *MI,uint32_t insn,uint64_t Address,MCRegisterInfo *Decoder)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  int64_t iVar6;
  uint32_t in_ESI;
  MCInst *in_RDI;
  bool bVar7;
  _Bool HasRt;
  _Bool HasRs;
  uint32_t Imm;
  uint32_t Rt;
  uint32_t Rs;
  uint in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  MCRegisterInfo *in_stack_ffffffffffffffc0;
  MCInst *mcInst;
  
  uVar2 = fieldFromInstruction(in_ESI,0x15,5);
  uVar3 = fieldFromInstruction(in_ESI,0x10,5);
  uVar4 = fieldFromInstruction(in_ESI,0,0x10);
  iVar6 = SignExtend64((ulong)uVar4,0x10);
  bVar1 = false;
  bVar7 = false;
  if (uVar3 == 0) {
    MCInst_setOpcode(in_RDI,0xe3);
    bVar1 = true;
  }
  else if (uVar2 == 0) {
    MCInst_setOpcode(in_RDI,0xe5);
    bVar7 = true;
  }
  else {
    bVar7 = uVar2 != uVar3;
    if (bVar7) {
      MCInst_setOpcode(in_RDI,0x102);
    }
    else {
      MCInst_setOpcode(in_RDI,0x106);
    }
    bVar1 = true;
  }
  if (bVar1) {
    uVar5 = getReg(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    MCOperand_CreateReg0(in_RDI,uVar5);
  }
  if (bVar7) {
    mcInst = in_RDI;
    uVar5 = getReg((MCRegisterInfo *)in_RDI,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    MCOperand_CreateReg0(mcInst,uVar5);
  }
  MCOperand_CreateImm0(in_RDI,(ulong)(uint)((int)iVar6 << 2));
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeBgtzGroupBranch_4(MCInst *MI, uint32_t insn,
		uint64_t Address, const MCRegisterInfo *Decoder)
{
	// If we are called then we can assume that MIPS32r6/MIPS64r6 is enabled
	// (otherwise we would have matched the BGTZ instruction from the earlier
	// ISA's instead).
	//
	// We have:
	//    0b000111 sssss ttttt iiiiiiiiiiiiiiii
	//      BGTZ    if rt == 0
	//      BGTZALC if rs == 0 && rt != 0
	//      BLTZALC if rs != 0 && rs == rt
	//      BLTUC   if rs != 0 && rs != rt

	uint32_t Rs = fieldFromInstruction(insn, 21, 5);
	uint32_t Rt = fieldFromInstruction(insn, 16, 5);
	uint32_t Imm = (uint32_t)SignExtend64(fieldFromInstruction(insn, 0, 16), 16) * 4;
	bool HasRs = false;
	bool HasRt = false;

	if (Rt == 0) {
		MCInst_setOpcode(MI, Mips_BGTZ);
		HasRs = true;
	} else if (Rs == 0) {
		MCInst_setOpcode(MI, Mips_BGTZALC);
		HasRt = true;
	} else if (Rs == Rt) {
		MCInst_setOpcode(MI, Mips_BLTZALC);
		HasRs = true;
	} else {
		MCInst_setOpcode(MI, Mips_BLTUC);
		HasRs = true;
		HasRt = true;
	}

	if (HasRs)
		MCOperand_CreateReg0(MI, getReg(Decoder, Mips_GPR32RegClassID, Rs));

	if (HasRt)
		MCOperand_CreateReg0(MI, getReg(Decoder, Mips_GPR32RegClassID, Rt));

	MCOperand_CreateImm0(MI, Imm);

	return MCDisassembler_Success;
}